

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recognition.cpp
# Opt level: O0

size_t TUPU::write_memory(void *contents,size_t size,size_t nmemb,void *userp)

{
  void *pvVar1;
  long *in_RCX;
  long in_RDX;
  long in_RSI;
  void *in_RDI;
  MemChunk *mem;
  size_t realsize;
  size_t local_8;
  
  local_8 = in_RSI * in_RDX;
  pvVar1 = realloc((void *)*in_RCX,in_RCX[1] + local_8 + 1);
  *in_RCX = (long)pvVar1;
  if (*in_RCX == 0) {
    fprintf(errStream,"not enough memory (realloc returned NULL)\n");
    local_8 = 0;
  }
  else {
    memcpy((void *)(*in_RCX + in_RCX[1]),in_RDI,local_8);
    in_RCX[1] = local_8 + in_RCX[1];
    *(undefined1 *)(*in_RCX + in_RCX[1]) = 0;
  }
  return local_8;
}

Assistant:

static
size_t write_memory(void *contents, size_t size, size_t nmemb, void *userp)
{
    size_t realsize = size * nmemb;
    MemChunk *mem = (MemChunk *)userp;

    mem->memory = (char*)realloc(mem->memory, mem->size + realsize + 1);
    if(mem->memory == NULL)
    {
        /* out of memory! */ 
        fprintf(errStream, "not enough memory (realloc returned NULL)\n");
        return 0;
    }
 
    memcpy(&(mem->memory[mem->size]), contents, realsize);
    mem->size += realsize;
    mem->memory[mem->size] = 0;
 
    return realsize;
}